

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_disable_screensaver.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char cVar8;
  byte bVar9;
  char *pcVar10;
  ALLEGRO_EVENT event;
  int local_78;
  int local_58;
  
  cVar8 = '@';
  if (argc == 2) {
    iVar3 = strcmp(argv[1],"-fullscreen");
    cVar8 = (iVar3 == 0) * '\x02' + '@';
  }
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    pcVar10 = "Could not init Allegro.\n";
  }
  else {
    al_install_keyboard();
    al_init_font_addon();
    al_set_new_display_flags(cVar8);
    lVar4 = al_create_display(0x280,0x1e0);
    if (lVar4 == 0) {
      pcVar10 = "Could not create display.\n";
    }
    else {
      lVar5 = al_create_builtin_font();
      if (lVar5 != 0) {
        uVar6 = al_create_event_queue();
        uVar7 = al_get_keyboard_event_source();
        al_register_event_source(uVar6,uVar7);
        uVar7 = al_get_display_event_source(lVar4);
        al_register_event_source(uVar6,uVar7);
        bVar9 = 1;
        do {
          pcVar10 = "Inhibited";
          if ((bVar9 & 1) != 0) {
            pcVar10 = "Normal";
          }
          do {
            do {
              al_map_rgb(0,0,0);
              al_clear_to_color();
              al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
              al_draw_textf(lVar5,0,"Screen saver: %s",pcVar10);
              al_flip_display();
              al_wait_for_event();
            } while (local_78 != 10);
            if (local_58 == 0x3b) {
              al_destroy_font(lVar5);
              al_destroy_event_queue(uVar6);
              return 0;
            }
          } while (local_58 != 0x4b);
          bVar2 = al_inhibit_screensaver();
          bVar9 = bVar9 ^ bVar2;
        } while( true );
      }
      pcVar10 = "Error creating builtin font\n";
    }
  }
  abort_example(pcVar10);
  iVar3 = __cxa_atexit();
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_FONT *font;
   ALLEGRO_EVENT_QUEUE *events;
   ALLEGRO_EVENT event;
   bool done = false;
   bool active = true;
   bool fullscreen = false;
 
   if (argc == 2) {
      if (!strcmp(argv[1], "-fullscreen")) {
         fullscreen = true;
      }
   }

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();
   al_init_font_addon();

   al_set_new_display_flags(ALLEGRO_GENERATE_EXPOSE_EVENTS |
      (fullscreen ? ALLEGRO_FULLSCREEN : 0));

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Could not create display.\n");
   }

   font = al_create_builtin_font();
   if (!font) {
      abort_example("Error creating builtin font\n");
   }

   events = al_create_event_queue();
   al_register_event_source(events, al_get_keyboard_event_source());
   /* For expose events */
   al_register_event_source(events, al_get_display_event_source(display));

   do {
      al_clear_to_color(al_map_rgb(0, 0, 0));
      al_draw_textf(font, al_map_rgb_f(1, 1, 1), 0, 0, 0,
         "Screen saver: %s", active ? "Normal" : "Inhibited");
      al_flip_display();
      al_wait_for_event(events, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_KEY_DOWN:
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
               done = true;
            else if (event.keyboard.keycode == ALLEGRO_KEY_SPACE) {
               if (al_inhibit_screensaver(active)) {
                  active = !active;
               }
            }
            break;
      }
   } while (!done);

   al_destroy_font(font);
   al_destroy_event_queue(events);

   return 0;
}